

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O1

void envy_bios_print_mux(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_mux_entry *peVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  ulong uVar9;
  
  uVar2 = (bios->mux).offset;
  if ((mask >> 0x15 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->mux).version;
  uVar9 = (ulong)(bVar1 >> 4);
  uVar6 = (ulong)(bVar1 & 0xf);
  if ((bios->mux).valid != '\0') {
    fprintf((FILE *)out,"MUX table at 0x%04x version %d.%d\n",(ulong)uVar2,uVar9,uVar6);
    envy_bios_dump_hex(bios,out,(uint)(bios->mux).offset,(uint)(bios->mux).hlen,mask);
    if ((bios->mux).entriesnum != '\0') {
      lVar5 = 0xf;
      uVar9 = 0;
      do {
        peVar3 = (bios->mux).entries;
        if (((mask >> 0x1e & 1) != 0) || (peVar3[uVar9].idx != '\x1f')) {
          fprintf((FILE *)out,"MUX %d:",uVar9 & 0xffffffff);
          if (peVar3[uVar9].idx == '\x1f') {
            fwrite(" UNUSED",7,1,(FILE *)out);
          }
          else {
            fprintf((FILE *)out," DCB %d");
          }
          puVar8 = peVar3->sub_loc + lVar5 + -3;
          lVar7 = 0;
          do {
            if (puVar8[-8] != 0x1f) {
              pcVar4 = "XPIO";
              if (puVar8[-0xc] == '\0') {
                pcVar4 = "GPIO";
              }
              fprintf((FILE *)out," %s: %s line %d val %d",
                      (long)&DAT_00274498 + (long)*(int *)((long)&DAT_00274498 + lVar7),pcVar4,
                      (ulong)puVar8[-8],(ulong)puVar8[-4]);
              if (*puVar8 != '\0') {
                fprintf((FILE *)out," unk7 %d");
              }
            }
            lVar7 = lVar7 + 4;
            puVar8 = puVar8 + 1;
          } while (lVar7 != 0x10);
          fputc(10,(FILE *)out);
        }
        envy_bios_dump_hex(bios,out,(uint)peVar3[uVar9].offset,(uint)(bios->mux).rlen,mask);
        uVar9 = uVar9 + 1;
        lVar5 = lVar5 + 0x14;
      } while (uVar9 < (bios->mux).entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse MUX table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar9,
          uVar6);
  return;
}

Assistant:

void envy_bios_print_mux (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset || !(mask & ENVY_BIOS_PRINT_MUX))
		return;
	if (!mux->valid) {
		fprintf(out, "Failed to parse MUX table at 0x%04x version %d.%d\n\n", mux->offset, mux->version >> 4, mux->version & 0xf);
		return;
	}
	fprintf(out, "MUX table at 0x%04x version %d.%d\n", mux->offset, mux->version >> 4, mux->version & 0xf);
	envy_bios_dump_hex(bios, out, mux->offset, mux->hlen, mask);
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		if (entry->idx != 0x1f || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "MUX %d:", i);
			if (entry->idx != 0x1f)
				fprintf(out, " DCB %d", entry->idx);
			else
				fprintf(out, " UNUSED");
			int j;
			for (j = 0; j < 4; j++) {
				if (entry->sub_line[j] != 0x1f) {
					const char *const subs[4] = {
						"OUT",
						"UNK1",
						"HPD",
						"DDC",
					};
					fprintf(out, " %s: %s line %d val %d", subs[j], entry->sub_loc[j]?"XPIO":"GPIO", entry->sub_line[j], entry->sub_val[j]);
					if (entry->sub_unk7[j])
						fprintf(out, " unk7 %d", entry->sub_unk7[j]);
				}
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, mux->rlen, mask);
	}
	fprintf(out, "\n");
}